

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall
mkvmuxer::Segment::AddAudioTrack(Segment *this,int32_t sample_rate,int32_t channels,int32_t number)

{
  bool bVar1;
  AudioTrack *this_00;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  AudioTrack *track;
  uint *in_stack_ffffffffffffff98;
  AudioTrack *in_stack_ffffffffffffffa0;
  AudioTrack *local_48;
  int32_t in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  uint64_t local_8;
  
  this_00 = (AudioTrack *)operator_new(0x90,(nothrow_t *)&std::nothrow);
  uVar2 = 0;
  local_48 = (AudioTrack *)0x0;
  if (this_00 != (AudioTrack *)0x0) {
    uVar2 = 1;
    AudioTrack::AudioTrack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_48 = this_00;
  }
  if (local_48 == (AudioTrack *)0x0) {
    local_8 = 0;
  }
  else {
    Track::set_type(&local_48->super_Track,2);
    Track::set_codec_id(&this_00->super_Track,in_RDI);
    AudioTrack::set_sample_rate(local_48,(double)in_ESI);
    AudioTrack::set_channels(local_48,(long)in_EDX);
    bVar1 = Tracks::AddTrack((Tracks *)local_48,(Track *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
    if (bVar1) {
      local_8 = Track::number(&local_48->super_Track);
    }
    else {
      if (local_48 != (AudioTrack *)0x0) {
        (*(local_48->super_Track)._vptr_Track[1])();
      }
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint64_t Segment::AddAudioTrack(int32_t sample_rate, int32_t channels,
                                int32_t number) {
  AudioTrack* const track = new (std::nothrow) AudioTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kAudio);
  track->set_codec_id(Tracks::kVorbisCodecId);
  track->set_sample_rate(sample_rate);
  track->set_channels(channels);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }

  return track->number();
}